

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cpp
# Opt level: O1

void __thiscall
sznet::net::EventLoopThread::EventLoopThread
          (EventLoopThread *this,ThreadInitCallback *cb,string *name)

{
  _Any_data local_68;
  code *pcStack_58;
  code *pcStack_50;
  ThreadInitCallback *local_40;
  Thread *local_38;
  
  this->m_loop = (EventLoop *)0x0;
  this->m_exiting = false;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  pcStack_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_40 = cb;
  local_68._M_unused._M_object = operator_new(0x18);
  *(code **)local_68._M_unused._0_8_ = threadFunc;
  *(undefined8 *)((long)local_68._M_unused._0_8_ + 8) = 0;
  *(EventLoopThread **)((long)local_68._M_unused._0_8_ + 0x10) = this;
  pcStack_50 = std::
               _Function_handler<void_(),_std::_Bind<void_(sznet::net::EventLoopThread::*(sznet::net::EventLoopThread_*))()>_>
               ::_M_invoke;
  pcStack_58 = std::
               _Function_handler<void_(),_std::_Bind<void_(sznet::net::EventLoopThread::*(sznet::net::EventLoopThread_*))()>_>
               ::_M_manager;
  local_38 = &this->m_thread;
  Thread::Thread(&this->m_thread,(ThreadFunc *)&local_68,name);
  if (pcStack_58 != (code *)0x0) {
    (*pcStack_58)(&local_68,&local_68,__destroy_functor);
  }
  (this->m_mutex).m_holder = 0;
  sz_mutex_init(&(this->m_mutex).m_mutex);
  (this->m_cond).m_mutex = &this->m_mutex;
  sz_cond_init(&(this->m_cond).m_cond);
  std::function<void_(sznet::net::EventLoop_*)>::function(&this->m_callback,local_40);
  return;
}

Assistant:

EventLoopThread::EventLoopThread(const ThreadInitCallback& cb, const string& name):
	m_loop(nullptr),
	m_exiting(false),
	m_thread(std::bind(&EventLoopThread::threadFunc, this), name),
	m_mutex(),
	m_cond(m_mutex),
	m_callback(cb)
{
}